

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq> *
rangeless::fn::in_groups_of
          (group_adjacent_by<rangeless::fn::impl::chunker,_rangeless::fn::impl::eq>
           *__return_storage_ptr__,size_t n)

{
  logic_error *this;
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (n != 0) {
    (__return_storage_ptr__->key_fn).chunk_size = n;
    (__return_storage_ptr__->key_fn).n_calls = 0;
    return __return_storage_ptr__;
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_b0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_b0 == plVar2) {
    local_a0 = *plVar2;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar2;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0._M_dataplus._M_p = (pointer)*plVar1;
  psVar3 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar3) {
    local_d0.field_2._M_allocated_capacity = *psVar3;
    local_d0.field_2._8_8_ = plVar1[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar3;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_90,0x1055);
  std::operator+(&local_50,&local_d0,&local_90);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_f0 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_f0 == plVar2) {
    local_e0 = *plVar2;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar2;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::logic_error::logic_error(this,(string *)&local_f0);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline impl::group_adjacent_by<impl::chunker> in_groups_of(size_t n)
    {
        if(n < 1) {
            RANGELESS_FN_THROW("Batch size must be at least 1.");
        }
        return { impl::chunker{ n, 0 }, {} };
    }